

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_libgcc-inl.h
# Opt level: O2

int GetStackTraceWithContext_libgcc(void **result,int max_depth,int skip_count,void *ucp)

{
  void **local_28;
  int local_20;
  int local_1c;
  int local_18;
  
  local_20 = skip_count + 2;
  local_1c = 0;
  local_28 = result;
  local_18 = max_depth;
  _Unwind_Backtrace(libgcc_backtrace_helper,&local_28);
  if (1 < (long)local_1c) {
    local_1c = local_1c - (uint)(local_28[(long)local_1c + -1] == (void *)0x0);
  }
  return local_1c;
}

Assistant:

static int GET_STACK_TRACE_OR_FRAMES {
  libgcc_backtrace_data data;
  data.array = result;
  // we're also skipping current and parent's frame
  data.skip = skip_count + 2;
  data.pos = 0;
  data.limit = max_depth;

  _Unwind_Backtrace(libgcc_backtrace_helper, &data);

  if (data.pos > 1 && data.array[data.pos - 1] == nullptr)
    --data.pos;

#if IS_STACK_FRAMES
  // No implementation for finding out the stack frame sizes.
  memset(sizes, 0, sizeof(*sizes) * data.pos);
#endif

  return data.pos;
}